

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unescape.cc
# Opt level: O0

uint32_t re2c::unesc_hex(char *s,char *s_end)

{
  uint32_t uVar1;
  uint32_t local_1c;
  uint32_t n;
  char *s_end_local;
  char *s_local;
  
  local_1c = 0;
  for (s_end_local = s + 2; s_end_local != s_end; s_end_local = s_end_local + 1) {
    uVar1 = hex_digit(*s_end_local);
    local_1c = uVar1 + local_1c * 0x10;
  }
  return local_1c;
}

Assistant:

uint32_t unesc_hex (const char * s, const char * s_end)
{
	uint32_t n = 0;
	for (s += 2; s != s_end; ++s)
	{
		n <<= 4;
		n += hex_digit (*s);
	}
	return n;
}